

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void PIT_FloorDrop(AActor *thing,FChangePosition *cpos)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  TFlags<ActorFlag6,_unsigned_int> local_48;
  TFlags<ActorFlag,_unsigned_int> local_44;
  TFlags<ActorFlag,_unsigned_int> local_40;
  TFlags<ActorFlag5,_unsigned_int> local_3c;
  TFlags<ActorFlag,_unsigned_int> local_38;
  TFlags<ActorFlag,_unsigned_int> local_34;
  TFlags<ActorFlag,_unsigned_int> local_30;
  TFlags<ActorFlag4,_unsigned_int> local_2c;
  double local_28;
  double oldz;
  double oldfloorz;
  FChangePosition *cpos_local;
  AActor *thing_local;
  
  oldz = thing->floorz;
  oldfloorz = (double)cpos;
  cpos_local = (FChangePosition *)thing;
  local_28 = AActor::Z(thing);
  P_AdjustFloorCeil((AActor *)cpos_local,(FChangePosition *)oldfloorz);
  if ((oldz != (double)cpos_local[0xc].sector) || (NAN(oldz) || NAN((double)cpos_local[0xc].sector))
     ) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_2c,
               (int)cpos_local + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
    if (uVar1 == 0) {
      bVar2 = false;
      if ((*(double *)&cpos_local[7].crushchange == 0.0) &&
         (!NAN(*(double *)&cpos_local[7].crushchange))) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_30,
                   (int)cpos_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
        bVar2 = true;
        if (uVar1 != 0) {
          dVar3 = AActor::Z((AActor *)cpos_local);
          bVar2 = false;
          if ((dVar3 == oldz) && (!NAN(dVar3) && !NAN(oldz))) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_34,
                       (int)cpos_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
            ;
            uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
            bVar2 = uVar1 == 0;
          }
        }
      }
      if (bVar2) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_38,
                   (int)cpos_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
        bVar2 = true;
        if (uVar1 == 0) {
          TFlags<ActorFlag5,_unsigned_int>::operator&
                    (&local_3c,
                     (int)cpos_local +
                     (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|
                     MF5_NODROPOFF));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
          bVar2 = true;
          if ((uVar1 == 0) &&
             (((*(uint *)(*(long *)oldfloorz + 0x1e0) & 4) != 0 ||
              (bVar2 = false,
              *(double *)((long)oldfloorz + 8) <= 9.0 && *(double *)((long)oldfloorz + 8) != 9.0))))
          {
            dVar3 = AActor::Z((AActor *)cpos_local);
            bVar2 = dVar3 - (double)cpos_local[0xc].sector <= *(double *)((long)oldfloorz + 8);
          }
        }
        if (bVar2) {
          AActor::SetZ((AActor *)cpos_local,(double)cpos_local[0xc].sector,true);
          P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
          AActor::UpdateRenderSectorList((AActor *)cpos_local);
        }
      }
      else {
        dVar3 = AActor::Z((AActor *)cpos_local);
        bVar2 = false;
        if ((dVar3 != oldz) || (NAN(dVar3) || NAN(oldz))) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_40,
                     (int)cpos_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
          bVar2 = uVar1 == 0;
        }
        if (bVar2) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_44,
                     (int)cpos_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
          bVar2 = false;
          if (uVar1 != 0) {
            TFlags<ActorFlag6,_unsigned_int>::operator&
                      (&local_48,(int)cpos_local + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL))
            ;
            uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
            bVar2 = uVar1 != 0;
          }
          if (bVar2) {
            AActor::AddZ((AActor *)cpos_local,-oldz + (double)cpos_local[0xc].sector,true);
            P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
            AActor::UpdateRenderSectorList((AActor *)cpos_local);
          }
        }
      }
      if ((cpos_local[0x15].moveamt != 0.0) &&
         (*(FChangePosition **)cpos_local[0x15].moveamt == cpos_local)) {
        dVar3 = AActor::Z((AActor *)cpos_local);
        *(double *)((long)cpos_local[0x15].moveamt + 0x60) =
             (dVar3 - local_28) + *(double *)((long)cpos_local[0x15].moveamt + 0x60);
      }
    }
  }
  return;
}

Assistant:

void PIT_FloorDrop(AActor *thing, FChangePosition *cpos)
{
	double oldfloorz = thing->floorz;
	double oldz = thing->Z();

	P_AdjustFloorCeil(thing, cpos);

	if (oldfloorz == thing->floorz) return;
	if (thing->flags4 & MF4_ACTLIKEBRIDGE) return; // do not move bridge things

	if (thing->Vel.Z == 0 &&
		(!(thing->flags & MF_NOGRAVITY) ||
		(thing->Z() == oldfloorz && !(thing->flags & MF_NOLIFTDROP))))
	{
		if ((thing->flags & MF_NOGRAVITY) || (thing->flags5 & MF5_MOVEWITHSECTOR) ||
			(((cpos->sector->Flags & SECF_FLOORDROP) || cpos->moveamt < 9)
			&& thing->Z() - thing->floorz <= cpos->moveamt))
		{
			thing->SetZ(thing->floorz);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
		}
	}
	else if ((thing->Z() != oldfloorz && !(thing->flags & MF_NOLIFTDROP)))
	{
		if ((thing->flags & MF_NOGRAVITY) && (thing->flags6 & MF6_RELATIVETOFLOOR))
		{
			thing->AddZ(-oldfloorz + thing->floorz);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}